

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

void Omega_h::update_class_sets(ClassSets *p_sets,InputMap *pl)

{
  _Base_ptr name;
  int iVar1;
  int iVar2;
  const_iterator cVar3;
  InputList *this;
  InputList *this_00;
  mapped_type *this_01;
  ulong uVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  ClassPair local_58;
  InputMap *local_50;
  const_iterator local_48;
  _Base_ptr local_40;
  ClassSets *local_38;
  
  local_38 = p_sets;
  cVar3._M_node = (_Base_ptr)InputMap::begin(pl);
  local_50 = pl;
  local_48._M_node = (_Base_ptr)InputMap::end(pl);
  do {
    if (cVar3._M_node == local_48._M_node) {
      return;
    }
    name = cVar3._M_node + 1;
    local_40 = cVar3._M_node;
    this = InputMap::get_list(local_50,(string *)name);
    uVar4 = (ulong)((long)(this->entries).
                          super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->entries).
                         super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4;
    uVar6 = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    while (i = (int)uVar6, (int)uVar5 != i) {
      this_00 = InputList::use_input<Omega_h::InputList>(this,i);
      if (((long)(this_00->entries).
                 super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this_00->entries).
                 super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) != 0x20) {
        fail("Expected \"%s\" to be an array of int pairs\n",*(undefined8 *)name);
      }
      iVar1 = InputList::get<int>(this_00,0);
      iVar2 = InputList::get<int>(this_00,1);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                ::operator[](local_38,(key_type *)name);
      local_58.dim = iVar1;
      local_58.id = iVar2;
      std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::
      emplace_back<Omega_h::ClassPair>(this_01,&local_58);
      uVar6 = (ulong)(i + 1);
    }
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(local_40);
  } while( true );
}

Assistant:

void update_class_sets(ClassSets* p_sets, InputMap& pl) {
  ClassSets& sets = *p_sets;
  for (auto& set_name : pl) {
    auto& pairs = pl.get_list(set_name);
    auto npairs = pairs.size();
    for (decltype(npairs) i = 0; i < npairs; ++i) {
      auto& pair = pairs.get_list(i);
      if (pair.size() != 2) {
        Omega_h_fail(
            "Expected \"%s\" to be an array of int pairs\n", set_name.c_str());
      }
      auto class_dim = Int(pair.get<int>(0));
      auto class_id = LO(pair.get<int>(1));
      sets[set_name].push_back({class_dim, class_id});
    }
  }
}